

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType * __thiscall
duckdb::LogicalType::DeepCopy(LogicalType *__return_storage_ptr__,LogicalType *this)

{
  ExtraTypeInfo *pEVar1;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_20;
  
  LogicalType(__return_storage_ptr__,this);
  if ((this->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pEVar1 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&this->type_info_);
    (*pEVar1->_vptr_ExtraTypeInfo[3])(&local_20,pEVar1);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&__return_storage_ptr__->type_info_,&local_20);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::DeepCopy() const {
	LogicalType copy = *this;
	if (type_info_) {
		copy.type_info_ = type_info_->Copy();
	}
	return copy;
}